

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  uint _h;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  int *piVar17;
  undefined4 *puVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  uint uVar22;
  undefined4 *puVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  undefined8 *puVar29;
  int nn;
  int iVar30;
  undefined8 *puVar31;
  uint uVar32;
  undefined4 *puVar33;
  ulong uVar34;
  undefined4 *puVar35;
  long lVar36;
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  uVar2 = bottom_im2col->w;
  uVar34 = (ulong)(int)uVar2;
  iVar3 = bottom_im2col->h;
  _h = bottom_im2col->c;
  iVar4 = top_blob->c;
  local_58 = 0;
  local_98._16_8_ = 0;
  local_98._24_4_ = 0;
  local_98._0_8_ = (undefined1 (*) [16])0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_98._32_8_ = (Allocator *)0x0;
  local_98._40_4_ = 0;
  local_98._44_4_ = 0;
  uVar26 = (uVar2 & 1) + (uVar2 >> 1);
  if ((long)uVar34 < 2) {
    uVar26 = uVar2;
  }
  Mat::create((Mat *)local_98,iVar3 << (1 < (long)uVar34),_h,uVar26,8,8,opt->workspace_allocator);
  if (0 < (int)uVar2 >> 1) {
    lVar19 = 0;
    uVar24 = 0;
    do {
      if (0 < (int)_h) {
        puVar31 = (undefined8 *)((undefined1 *)local_98._0_8_ + local_58 * uVar24 * local_98._16_8_)
        ;
        uVar27 = 0;
        do {
          if (0 < iVar3) {
            puVar29 = (undefined8 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar27 + lVar19);
            iVar30 = iVar3;
            do {
              uVar16 = puVar29[1];
              *puVar31 = *puVar29;
              puVar31[1] = uVar16;
              puVar31 = puVar31 + 2;
              puVar29 = puVar29 + uVar2;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != _h);
      }
      uVar24 = uVar24 + 1;
      lVar19 = lVar19 + 0x10;
    } while (uVar24 != (uint)((int)uVar2 >> 1));
  }
  uVar24 = uVar34 & 0xfffffffffffffffe;
  if ((uint)uVar24 != uVar2) {
    pvVar20 = (void *)(uVar24 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)_h) {
        uVar26 = ((uint)(uVar24 >> 0x1f) & 1) + (int)uVar24;
        puVar31 = (undefined8 *)
                  ((undefined1 *)local_98._0_8_ +
                  (long)(int)(((int)uVar26 >> 1) + ((int)uVar24 - (uVar26 & 0xfffffffe))) * local_58
                  * local_98._16_8_);
        uVar27 = 0;
        do {
          if (0 < iVar3) {
            puVar29 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar27 + (long)pvVar20);
            iVar30 = iVar3;
            do {
              *puVar31 = *puVar29;
              puVar31 = puVar31 + 1;
              puVar29 = puVar29 + uVar34;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != _h);
      }
      uVar24 = uVar24 + 1;
      pvVar20 = (void *)((long)pvVar20 + 8);
    } while ((long)uVar24 < (long)uVar34);
  }
  if (0 < iVar4 >> 2) {
    local_38 = top_blob->data;
    local_40 = top_blob->elemsize * top_blob->cstep;
    pauVar28 = (undefined1 (*) [16])kernel->data;
    local_48 = kernel->elemsize * kernel->cstep;
    local_50 = (ulong)(uint)(iVar4 >> 2);
    uVar24 = 0;
    do {
      puVar35 = (undefined4 *)(uVar24 * 4 * local_40 + (long)local_38);
      puVar23 = (undefined4 *)((uVar24 * 4 + 1) * local_40 + (long)local_38);
      puVar18 = (undefined4 *)((uVar24 * 4 + 2) * local_40 + (long)local_38);
      puVar33 = (undefined4 *)((uVar24 * 4 + 3) * local_40 + (long)local_38);
      if ((int)uVar2 < 2) {
        uVar27 = 0;
      }
      else {
        uVar21 = 0;
        pauVar25 = (undefined1 (*) [16])local_98._0_8_;
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar1 = *pauVar25;
            auVar8 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            vpunpcklbw_avx(auVar1,auVar8);
            vpunpckhbw_avx(auVar1,auVar8);
            auVar1 = *pauVar28;
            auVar8 = pauVar28[1];
            auVar9 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar8);
            vpunpcklbw_avx(auVar1,auVar9);
            vpunpckhbw_avx(auVar1,auVar9);
            vpunpcklbw_avx(auVar8,auVar10);
            vpunpckhbw_avx(auVar8,auVar10);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar12 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar13 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar14 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar15 = vpunpcklqdq_avx(auVar1,auVar12);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar12);
          auVar1 = vpaddd_avx(auVar15,auVar1);
          auVar12 = vpunpcklqdq_avx(auVar8,auVar9);
          auVar8 = vpunpckhqdq_avx(auVar8,auVar9);
          auVar8 = vpaddd_avx(auVar8,auVar12);
          auVar1 = vpaddd_avx(auVar1,auVar8);
          auVar9 = vpunpcklqdq_avx(auVar13,auVar14);
          auVar8 = vpunpckhqdq_avx(auVar13,auVar14);
          auVar8 = vpaddd_avx(auVar9,auVar8);
          auVar9 = vpunpcklqdq_avx(auVar10,auVar11);
          *puVar35 = auVar1._0_4_;
          *puVar23 = auVar1._4_4_;
          *puVar18 = auVar1._8_4_;
          *puVar33 = auVar1._12_4_;
          auVar1 = vpunpckhqdq_avx(auVar10,auVar11);
          auVar1 = vpaddd_avx(auVar1,auVar9);
          auVar1 = vpaddd_avx(auVar8,auVar1);
          puVar35[1] = auVar1._0_4_;
          puVar23[1] = auVar1._4_4_;
          puVar18[1] = auVar1._8_4_;
          puVar33[1] = auVar1._12_4_;
          puVar35 = puVar35 + 2;
          puVar23 = puVar23 + 2;
          puVar18 = puVar18 + 2;
          puVar33 = puVar33 + 2;
          uVar27 = uVar21 + 2;
          lVar19 = uVar21 + 3;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + local_98._16_8_ * local_58);
          uVar21 = uVar27;
        } while (lVar19 < (long)uVar34);
      }
      if ((int)uVar27 < (int)uVar2) {
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)((undefined1 *)local_98._0_8_ +
                                     (ulong)(((uint)uVar27 & 1) + ((uint)(uVar27 >> 1) & 0x7fffffff)
                                            ) * local_98._16_8_ * local_58);
            vpmovsxbw_avx(auVar1);
            auVar1 = *pauVar28;
            auVar8 = pauVar28[1];
            auVar9 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar8);
            vpunpcklbw_avx(auVar1,auVar9);
            vpunpckhbw_avx(auVar1,auVar9);
            vpunpcklbw_avx(auVar8,auVar10);
            vpunpckhbw_avx(auVar8,auVar10);
            halt_baddata();
          }
          auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpcklqdq_avx(auVar1,auVar10);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar10);
          auVar1 = vpaddd_avx(auVar11,auVar1);
          auVar10 = vpunpcklqdq_avx(auVar8,auVar9);
          auVar8 = vpunpckhqdq_avx(auVar8,auVar9);
          auVar8 = vpaddd_avx(auVar8,auVar10);
          auVar1 = vpaddd_avx(auVar1,auVar8);
          *puVar35 = auVar1._0_4_;
          *puVar23 = auVar1._4_4_;
          *puVar18 = auVar1._8_4_;
          *puVar33 = auVar1._12_4_;
          puVar35 = puVar35 + 1;
          puVar23 = puVar23 + 1;
          puVar18 = puVar18 + 1;
          puVar33 = puVar33 + 1;
          uVar26 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar26;
        } while (uVar26 != uVar2);
      }
      uVar24 = uVar24 + 1;
      pauVar28 = (undefined1 (*) [16])(*pauVar28 + local_48);
    } while (uVar24 != local_50);
  }
  uVar24 = (long)iVar4 & 0xfffffffffffffffc;
  if ((int)uVar24 != iVar4) {
    pvVar20 = top_blob->data;
    sVar5 = top_blob->elemsize;
    sVar6 = top_blob->cstep;
    pvVar7 = kernel->data;
    lVar19 = kernel->elemsize * kernel->cstep;
    do {
      puVar31 = (undefined8 *)(sVar5 * sVar6 * uVar24 + (long)pvVar20);
      uVar26 = (uint)uVar24;
      if ((int)uVar2 < 2) {
        uVar27 = 0;
      }
      else {
        uVar22 = uVar26 + 3;
        if (-1 < (int)uVar26) {
          uVar22 = uVar26;
        }
        uVar21 = 0;
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar1 = *(undefined1 (*) [16])
                      ((undefined1 *)local_98._0_8_ + (uVar21 >> 1) * local_98._16_8_ * local_58);
            auVar8 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            vpunpcklbw_avx(auVar1,auVar8);
            vpunpckhbw_avx(auVar1,auVar8);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)((int)(((int)uVar22 >> 2) + (uVar26 - (uVar22 & 0xfffffffc))) *
                                      lVar19 + (long)pvVar7);
            vpmovsxbw_avx(auVar8);
            halt_baddata();
          }
          auVar1 = vpshufd_avx((undefined1  [16])0x0,0xee);
          auVar1 = vpaddd_avx(auVar1,(undefined1  [16])0x0);
          auVar8 = vpshufd_avx((undefined1  [16])0x0,0xee);
          auVar8 = vpaddd_avx(auVar8,(undefined1  [16])0x0);
          auVar1 = vphaddd_avx(auVar1,auVar8);
          auVar1 = vpshufd_avx(auVar1,0xe8);
          *puVar31 = auVar1._0_8_;
          puVar31 = puVar31 + 1;
          uVar27 = uVar21 + 2;
          lVar36 = uVar21 + 3;
          uVar21 = uVar27;
        } while (lVar36 < (long)uVar34);
      }
      if ((int)uVar27 < (int)uVar2) {
        uVar22 = uVar26 + 3;
        if (-1 < (int)uVar26) {
          uVar22 = uVar26;
        }
        do {
          if (0 < (int)(_h * iVar3)) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)((undefined1 *)local_98._0_8_ +
                                     (ulong)(((uint)uVar27 & 1) + ((uint)(uVar27 >> 1) & 0x7fffffff)
                                            ) * local_98._16_8_ * local_58);
            vpmovsxbw_avx(auVar9);
            auVar10._8_8_ = 0;
            auVar10._0_8_ =
                 *(ulong *)((int)(((int)uVar22 >> 2) + (uVar26 - (uVar22 & 0xfffffffc))) * lVar19 +
                           (long)pvVar7);
            vpmovsxbw_avx(auVar10);
            halt_baddata();
          }
          auVar1 = vphaddd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar1 = vphaddd_avx(auVar1,auVar1);
          *(int *)puVar31 = auVar1._0_4_;
          puVar31 = (undefined8 *)((long)puVar31 + 4);
          uVar32 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar32;
        } while (uVar32 != uVar2);
      }
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)iVar4);
  }
  piVar17 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_98._0_8_ != (undefined1 (*) [16])0x0) {
          free((void *)local_98._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_98._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}